

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMutex_POSIX.c
# Opt level: O0

UINT8 OSMutex_Init(OS_MUTEX **retMutex,UINT8 initLocked)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  int retVal;
  OS_MUTEX *mtx;
  UINT8 initLocked_local;
  OS_MUTEX **retMutex_local;
  
  __mutex = (pthread_mutex_t *)calloc(1,0x28);
  if (__mutex == (pthread_mutex_t *)0x0) {
    retMutex_local._7_1_ = 0xff;
  }
  else {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      if (initLocked != '\0') {
        OSMutex_Lock((OS_MUTEX *)&__mutex->__data);
      }
      *retMutex = (OS_MUTEX *)__mutex;
      retMutex_local._7_1_ = '\0';
    }
    else {
      free(__mutex);
      retMutex_local._7_1_ = 0x80;
    }
  }
  return retMutex_local._7_1_;
}

Assistant:

UINT8 OSMutex_Init(OS_MUTEX** retMutex, UINT8 initLocked)
{
	OS_MUTEX* mtx;
	int retVal;
	
	mtx = (OS_MUTEX*)calloc(1, sizeof(OS_MUTEX));
	if (mtx == NULL)
		return 0xFF;
	
	retVal = pthread_mutex_init(&mtx->hMutex, NULL);
	if (retVal)
	{
		free(mtx);
		return 0x80;
	}
	if (initLocked)
		OSMutex_Lock(mtx);
	
	*retMutex = mtx;
	return 0x00;
}